

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetGXMarkerInfo(ndicapi *pol,int port,int marker)

{
  int iVar1;
  char (*pacVar2) [12];
  unsigned_long uVar3;
  
  iVar1 = 0;
  if (0xffffffeb < marker - 0x55U) {
    if (port - 0x31U < 3) {
      pacVar2 = pol->GxInformation + (port - 0x31U);
    }
    else {
      if (8 < port - 0x41U) {
        return 0;
      }
      pacVar2 = pol->GxPassiveInformation + (port - 0x41U);
    }
    uVar3 = ndiHexToUnsignedLong(*pacVar2 + (0x4c - marker),1);
    iVar1 = (int)uVar3;
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiGetGXMarkerInfo(ndicapi* pol, int port, int marker)
{
  char* dp;

  if (marker < 'A' || marker > 'T')
  {
    return 0;
  }

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxInformation[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveInformation[port - 'A'];
  }
  else
  {
    return 0;
  }
  dp += 11 - (marker - 'A');

  return (int)ndiHexToUnsignedLong(dp, 1);
}